

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O3

int lua_cjson_new(lua_State *l)

{
  undefined1 auVar1 [16];
  undefined4 *puVar2;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  luaL_Reg reg [11];
  luaL_Reg alStack_c8 [11];
  
  memcpy(alStack_c8,&DAT_00181ca0,0xb0);
  lVar4 = 0;
  fpconv_init();
  lua_createtable(l,0,0);
  puVar2 = (undefined4 *)lua_newuserdata(l,0x548);
  lua_createtable(l,0,0);
  lua_pushcclosure(l,json_destroy_config,0);
  lua_setfield(l,-2,"__gc");
  lua_setmetatable(l,-2);
  *(undefined8 *)(puVar2 + 0x148) = 0x200000000;
  *(undefined8 *)(puVar2 + 0x14a) = 0x3e80000000a;
  puVar2[0x150] = 1000;
  *(undefined8 *)(puVar2 + 0x14c) = 0xe00000000;
  *(undefined8 *)(puVar2 + 0x14e) = 0x100000001;
  strbuf_init((strbuf_t *)(puVar2 + 0x140),0);
  do {
    *(undefined8 *)(puVar2 + lVar4) = 0xc0000000c;
    *(undefined8 *)((long)(puVar2 + lVar4) + 8) = 0xc0000000c;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x100);
  puVar2[0x7b] = 0;
  puVar2[0x7d] = 1;
  puVar2[0x5b] = 2;
  puVar2[0x5d] = 3;
  puVar2[0x3a] = 8;
  *puVar2 = 10;
  puVar2[0x20] = 0xb;
  *(undefined8 *)(puVar2 + 9) = 0xb0000000b;
  puVar2[0xd] = 0xb;
  puVar2[0x66] = 0xd;
  puVar2[0x69] = 0xd;
  puVar2[0x49] = 0xd;
  puVar2[0x6e] = 0xd;
  puVar2[0x4e] = 0xd;
  puVar2[0x74] = 0xd;
  puVar2[0x22] = 0xd;
  *(undefined8 *)(puVar2 + 0x2b) = 0x90000000d;
  puVar2[0x2d] = 0xd;
  auVar1 = _DAT_00160820;
  uVar3 = 0;
  auVar5 = _DAT_00160810;
  do {
    if (SUB164(auVar5 ^ auVar1,4) == -0x80000000 && SUB164(auVar5 ^ auVar1,0) < -0x7ffffff6) {
      puVar2[uVar3 + 0x30] = 0xd;
      puVar2[uVar3 | 0x31] = 0xd;
    }
    uVar3 = uVar3 + 2;
    lVar4 = auVar5._8_8_;
    auVar5._0_8_ = auVar5._0_8_ + 2;
    auVar5._8_8_ = lVar4 + 2;
  } while (uVar3 != 10);
  memset(puVar2 + 0x100,0,0x100);
  *(undefined1 *)((long)puVar2 + 0x422) = 0x22;
  *(undefined1 *)(puVar2 + 0x117) = 0x5c;
  *(undefined1 *)((long)puVar2 + 0x42f) = 0x2f;
  *(undefined1 *)((long)puVar2 + 0x462) = 8;
  *(undefined2 *)(puVar2 + 0x11d) = 0x7509;
  *(undefined1 *)((long)puVar2 + 0x46e) = 10;
  *(undefined1 *)((long)puVar2 + 0x466) = 0xc;
  *(undefined1 *)((long)puVar2 + 0x472) = 0xd;
  luaL_setfuncs(l,alStack_c8,1);
  lua_pushlightuserdata(l,(void *)0x0);
  lua_setfield(l,-2,"null");
  lua_pushstring(l,"cjson");
  lua_setfield(l,-2,"NAME");
  lua_pushstring(l,"2.1devel");
  lua_setfield(l,-2,"VERSION");
  return 1;
}

Assistant:

static int lua_cjson_new(lua_State *l)
{
    luaL_Reg reg[] = {
        { "decode", json_decode },
        { "decode_invalid_numbers", json_cfg_decode_invalid_numbers },
        { "decode_max_depth", json_cfg_decode_max_depth },
        { "encode", json_encode },
        { "encode_invalid_numbers", json_cfg_encode_invalid_numbers },
        { "encode_keep_buffer", json_cfg_encode_keep_buffer },
        { "encode_max_depth", json_cfg_encode_max_depth },
        { "encode_number_precision", json_cfg_encode_number_precision },
        { "encode_sparse_array", json_cfg_encode_sparse_array },
        { "new", lua_cjson_new },
        { NULL, NULL }
    };

    /* Initialise number conversions */
    fpconv_init();

    /* cjson module table */
    lua_newtable(l);

    /* Register functions with config data as upvalue */
    json_create_config(l);
    luaL_setfuncs(l, reg, 1);

    /* Set cjson.null */
    lua_pushlightuserdata(l, NULL);
    lua_setfield(l, -2, "null");

    /* Set module name / version fields */
    lua_pushliteral(l, CJSON_MODNAME);
    lua_setfield(l, -2, "NAME");
    lua_pushliteral(l, CJSON_VERSION);
    lua_setfield(l, -2, "VERSION");

    return 1;
}